

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

Orphan<capnp::DynamicValue> * __thiscall
capnp::compiler::ValueTranslator::compileValueInner
          (Orphan<capnp::DynamicValue> *__return_storage_ptr__,ValueTranslator *this,Reader src,
          Type type)

{
  ErrorReporter *pEVar1;
  uint8_t uVar2;
  undefined2 *puVar3;
  Builder builder;
  Reader src_00;
  Reader assignments;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  word *pwVar9;
  anon_union_8_2_eba6ea51_for_Type_5 aVar10;
  word wVar11;
  undefined1 auVar12 [8];
  EVP_PKEY_CTX EVar13;
  int iVar14;
  ulong uVar15;
  int *__s1;
  WirePointer *pWVar16;
  long lVar17;
  StructSchema SVar18;
  undefined1 auVar19 [8];
  Which WVar20;
  size_t sVar21;
  RawBrandedSchema *pRVar22;
  ulong uVar23;
  OrphanBuilder *builder_00;
  char (*in_R8) [2];
  undefined1 uVar24;
  uint index;
  Schema elementCount;
  bool bVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  StringPtr name_00;
  Type type_00;
  ArrayPtr<const_capnp::word> array;
  ReaderOptions options;
  Array<capnp::word> copy;
  NullableValue<kj::Array<const_unsigned_char>_> data;
  NullableValue<capnp::DynamicValue::Reader> constValue;
  Reader name;
  Reader srcList;
  undefined1 local_3e8 [80];
  Type local_398;
  Array<capnp::word> local_388;
  Orphan<capnp::DynamicList> local_368;
  undefined1 local_338 [8];
  undefined1 auStack_330 [8];
  undefined1 local_328 [256];
  undefined1 local_228 [16];
  SegmentBuilder *local_218;
  WirePointer *pWStack_210;
  StructPointerCount SStack_204;
  word *local_208;
  ListElementCount local_200;
  Resolver *local_1f0;
  anon_union_8_2_eba6ea51_for_Type_5 local_1e8;
  SegmentBuilder *local_1e0;
  WirePointer *pWStack_1d8;
  uint local_1d0;
  undefined1 local_1b8 [48];
  SegmentReader *local_188;
  ListReader local_180;
  Builder local_150;
  StructReader local_120;
  Reader local_f0;
  Reader local_a8;
  StructReader local_60;
  
  local_398.field_4 = type.field_4;
  local_398._0_8_ = type._0_8_;
  if (src._reader.dataSize < 0x10) goto switchD_001d51db_caseD_0;
  puVar3 = (undefined2 *)src._reader.data;
  uVar2 = type.listDepth;
  WVar20 = type.baseType;
  pWVar16 = src._reader.pointers;
  local_328._0_8_ = pWVar16;
  switch(*puVar3) {
  case 0:
    break;
  case 1:
    if (src._reader.dataSize < 0x80) {
      lVar17 = 0;
    }
    else {
      lVar17 = *(long *)(puVar3 + 4);
    }
    __return_storage_ptr__->type = UINT;
    goto LAB_001d5b7c;
  case 2:
    if (src._reader.dataSize < 0x80) {
      uVar15 = 0;
    }
    else {
      uVar15 = *(ulong *)(puVar3 + 4);
      if (0x8000000000000000 < uVar15) {
        uVar15 = 0;
        if (0x9f < src._reader.dataSize) {
          uVar15 = (ulong)*(uint *)(puVar3 + 8);
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,(ulong)*(uint *)(puVar3 + 2),uVar15,
                   "Integer is too big to be negative.",0x23);
        break;
      }
    }
    lVar17 = -uVar15;
    __return_storage_ptr__->type = INT;
LAB_001d5b7c:
    (__return_storage_ptr__->field_1).intValue = lVar17;
    goto LAB_001d518a;
  case 3:
    uVar26 = 0;
    uVar27 = 0;
    if (0x7f < src._reader.dataSize) {
      uVar26 = (undefined4)*(undefined8 *)(puVar3 + 4);
      uVar27 = (undefined4)((ulong)*(undefined8 *)(puVar3 + 4) >> 0x20);
    }
    __return_storage_ptr__->type = FLOAT;
    (__return_storage_ptr__->field_1).intValue = CONCAT44(uVar27,uVar26);
    goto LAB_001d518a;
  case 4:
    if (uVar2 == '\0' && WVar20 == DATA) {
      bVar25 = src._reader.pointerCount == 0;
      if (bVar25) {
        local_328._0_8_ = (WirePointer *)0x0;
      }
      local_328._8_4_ = 0x7fffffff;
      if (!bVar25) {
        local_328._8_4_ = src._reader.nestingLimit;
      }
      local_338._0_4_ = UNKNOWN;
      local_338._4_4_ = 0;
      auStack_330._0_4_ = UNKNOWN;
      auStack_330._4_4_ = 0;
      if (!bVar25) {
        local_338._0_4_ = (Type)src._reader.segment;
        local_338._4_4_ = src._reader.segment._4_4_;
        auStack_330._0_4_ = (Type)src._reader.capTable;
        auStack_330._4_4_ = src._reader.capTable._4_4_;
      }
      capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_338,(void *)0x0,0);
      capnp::_::OrphanBuilder::copy
                ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
      local_3e8._8_8_ = auStack_330;
      local_3e8._16_8_ = local_328._0_8_;
      local_3e8._24_8_ = local_328._8_8_;
      local_3e8._0_8_ = local_338;
      _auStack_330 = (undefined1  [16])capnp::_::OrphanBuilder::asData((OrphanBuilder *)local_3e8);
      local_338._0_4_ = 7;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_338,(OrphanBuilder *)local_3e8);
      DynamicValue::Builder::~Builder((Builder *)local_338);
    }
    else {
      bVar25 = src._reader.pointerCount == 0;
      if (bVar25) {
        local_328._0_8_ = (WirePointer *)0x0;
      }
      local_328._8_4_ = 0x7fffffff;
      if (!bVar25) {
        local_328._8_4_ = src._reader.nestingLimit;
      }
      local_338._0_4_ = UNKNOWN;
      local_338._4_4_ = 0;
      auStack_330._0_4_ = UNKNOWN;
      auStack_330._4_4_ = 0;
      if (!bVar25) {
        local_338._0_4_ = (Type)src._reader.segment;
        local_338._4_4_ = src._reader.segment._4_4_;
        auStack_330._0_4_ = (Type)src._reader.capTable;
        auStack_330._4_4_ = src._reader.capTable._4_4_;
      }
      capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_338,(void *)0x0,0);
      capnp::_::OrphanBuilder::copy
                ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
      local_3e8._8_8_ = auStack_330;
      local_3e8._16_8_ = local_328._0_8_;
      local_3e8._24_8_ = local_328._8_8_;
      local_3e8._0_8_ = local_338;
      capnp::_::OrphanBuilder::asText((Builder *)local_228,(OrphanBuilder *)local_3e8);
      local_328._8_8_ = local_218;
      local_328._0_8_ = local_228._8_8_;
      auStack_330 = (undefined1  [8])local_228._0_8_;
      local_338._0_4_ = 6;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_338,(OrphanBuilder *)local_3e8);
      DynamicValue::Builder::~Builder((Builder *)local_338);
    }
LAB_001d5abb:
    if ((SegmentBuilder *)local_3e8._8_8_ == (SegmentBuilder *)0x0) {
      return __return_storage_ptr__;
    }
    builder_00 = (OrphanBuilder *)local_3e8;
LAB_001d5acc:
    capnp::_::OrphanBuilder::euthanize(builder_00);
    return __return_storage_ptr__;
  case 5:
    bVar25 = src._reader.pointerCount == 0;
    if (bVar25) {
      pWVar16 = (WirePointer *)0x0;
    }
    if (bVar25) {
      src._reader.nestingLimit = 0x7fffffff;
    }
    local_338._0_4_ = UNKNOWN;
    local_338._4_4_ = 0;
    auStack_330._0_4_ = UNKNOWN;
    auStack_330._4_4_ = 0;
    if (!bVar25) {
      local_338._0_4_ = (Type)src._reader.segment;
      local_338._4_4_ = src._reader.segment._4_4_;
      auStack_330._0_4_ = (Type)src._reader.capTable;
      auStack_330._4_4_ = src._reader.capTable._4_4_;
    }
    local_328._0_8_ = pWVar16;
    local_328._8_4_ = src._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)local_228,(PointerReader *)local_338,(word *)0x0);
    local_328._0_8_ = (WirePointer *)0x0;
    local_328._8_4_ = 0x7fffffff;
    if (SStack_204 != 0) {
      local_328._0_8_ = pWStack_210;
      local_328._8_4_ = local_200;
    }
    local_338._0_4_ = 0;
    local_338._4_4_ = 0;
    auStack_330._0_4_ = UNKNOWN;
    auStack_330._4_4_ = 0;
    if (SStack_204 != 0) {
      local_338._0_4_ = local_228._0_4_;
      local_338._4_4_ = local_228._4_4_;
      auStack_330._0_4_ = local_228._8_4_;
      auStack_330._4_4_ = local_228._12_4_;
    }
    name_00.content =
         (ArrayPtr<const_char>)
         capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)local_338,(void *)0x0,0);
    sVar21 = name_00.content.size_;
    __s1 = (int *)name_00.content.ptr;
    if ((local_398.baseType == ENUM) && (local_398.listDepth == '\0')) {
      local_3e8._0_8_ = Type::asEnum(&local_398);
      EnumSchema::findEnumerantByName
                ((Maybe<capnp::EnumSchema::Enumerant> *)local_338,(EnumSchema *)local_3e8,name_00);
      if (local_338[0] == (EVP_PKEY_CTX)0x1) {
        __return_storage_ptr__->type = ENUM;
        (__return_storage_ptr__->field_1).intValue = (int64_t)auStack_330;
        (__return_storage_ptr__->field_1).enumValue.value = local_328._0_2_;
        goto LAB_001d518a;
      }
    }
    else {
      if (sVar21 == 4) {
        iVar14 = bcmp(__s1,"nan",3);
        if (iVar14 == 0) {
          __return_storage_ptr__->type = FLOAT;
          lVar17 = 0x7ff8000000000000;
        }
        else {
          if (*(char *)((long)__s1 + 2) != 'f' || (short)*__s1 != 0x6e69) goto LAB_001d5f81;
          __return_storage_ptr__->type = FLOAT;
          lVar17 = 0x7ff0000000000000;
        }
        goto LAB_001d5b7c;
      }
      if (sVar21 == 6) {
        iVar14 = bcmp(__s1,"false",5);
        if (iVar14 == 0) {
          __return_storage_ptr__->type = BOOL;
          (__return_storage_ptr__->field_1).boolValue = false;
          goto LAB_001d518a;
        }
      }
      else if (sVar21 == 5) {
        if (*__s1 == 0x64696f76) {
          __return_storage_ptr__->type = VOID;
          goto LAB_001d518a;
        }
        if (*__s1 == 0x65757274) {
          __return_storage_ptr__->type = BOOL;
          (__return_storage_ptr__->field_1).boolValue = true;
          goto LAB_001d518a;
        }
      }
    }
LAB_001d5f81:
    (**this->resolver->_vptr_Resolver)(local_3e8);
    local_338[0] = local_3e8[0];
    if (local_3e8[0] == (EVP_PKEY_CTX)0x1) {
      DynamicValue::Reader::Reader((Reader *)auStack_330,(Reader *)(local_3e8 + 8));
    }
    if (((byte)local_3e8[0] & 1) != 0) {
      DynamicValue::Reader::~Reader((Reader *)(local_3e8 + 8));
    }
    EVar13 = local_338[0];
    if (local_338[0] != (EVP_PKEY_CTX)0x1) {
LAB_001d6029:
      __return_storage_ptr__->type = UNKNOWN;
      (__return_storage_ptr__->builder).tag.content = 0;
      (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
      (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
      (__return_storage_ptr__->builder).location = (word *)0x0;
      goto LAB_001d603a;
    }
    DynamicValue::Reader::Reader(&local_a8,(Reader *)auStack_330);
    Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
              (__return_storage_ptr__,&this->orphanage,&local_a8);
    DynamicValue::Reader::~Reader(&local_a8);
    goto LAB_001d5284;
  case 6:
    if (uVar2 != '\0') {
      type_00 = (Type)Type::asList(&local_398);
      bVar25 = src._reader.pointerCount == 0;
      if (bVar25) {
        pWVar16 = (WirePointer *)0x0;
      }
      iVar14 = 0x7fffffff;
      if (!bVar25) {
        iVar14 = src._reader.nestingLimit;
      }
      local_338._0_4_ = UNKNOWN;
      local_338._4_4_ = 0;
      auStack_330._0_4_ = UNKNOWN;
      auStack_330._4_4_ = 0;
      if (!bVar25) {
        local_338._0_4_ = (Type)src._reader.segment;
        local_338._4_4_ = src._reader.segment._4_4_;
        auStack_330._0_4_ = (Type)src._reader.capTable;
        auStack_330._4_4_ = src._reader.capTable._4_4_;
      }
      local_328._0_8_ = pWVar16;
      local_328._8_4_ = iVar14;
      capnp::_::PointerReader::getList
                ((ListReader *)&local_1e8,(PointerReader *)local_338,INLINE_COMPOSITE,(word *)0x0);
      Orphanage::newOrphan(&local_368,&this->orphanage,(ListSchema)type_00,local_1d0);
      Orphan<capnp::DynamicList>::get((Builder *)local_228,&local_368);
      if (local_1d0 != 0) {
        index = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_120,(ListReader *)&local_1e8,index);
          src_00._reader.capTable._0_4_ = (int)local_120.capTable;
          src_00._reader.segment = local_120.segment;
          src_00._reader.capTable._4_4_ = (int)((ulong)local_120.capTable >> 0x20);
          src_00._reader.data._0_4_ = (int)local_120.data;
          src_00._reader.data._4_4_ = (int)((ulong)local_120.data >> 0x20);
          src_00._reader.pointers._0_4_ = (int)local_120.pointers;
          src_00._reader.pointers._4_4_ = (int)((ulong)local_120.pointers >> 0x20);
          src_00._reader.dataSize = local_120.dataSize;
          src_00._reader._36_4_ = local_120._36_4_;
          src_00._reader.nestingLimit = local_120.nestingLimit;
          src_00._reader._44_4_ = local_120._44_4_;
          compileValue((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)local_3e8,this,src_00,type_00);
          local_338[0] = local_3e8[0];
          EVar13 = local_3e8[0];
          if (local_3e8[0] != (EVP_PKEY_CTX)0x0) {
            local_328._8_8_ = local_3e8._24_8_;
            local_328._0_8_ = local_3e8._16_8_;
            auStack_330 = (undefined1  [8])local_3e8._8_8_;
            local_328._24_8_ = local_3e8._40_8_;
            local_328._32_8_ = local_3e8._48_8_;
            local_328._40_8_ = local_3e8._56_8_;
            local_328._16_8_ = local_3e8._32_8_;
            DynamicList::Builder::adopt
                      ((Builder *)local_228,index,(Orphan<capnp::DynamicValue> *)auStack_330);
            EVar13 = local_338[0];
          }
          if ((((byte)EVar13 & 1) != 0) &&
             ((SegmentReader *)local_328._24_8_ != (SegmentReader *)0x0)) {
            capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_328 + 0x10));
          }
          index = index + 1;
        } while (index < local_1d0);
      }
      Orphan<capnp::DynamicList>::get((Builder *)local_3e8,&local_368);
      local_328._40_8_ = local_3e8._48_8_;
      local_328._24_8_ = local_3e8._32_8_;
      local_328._32_8_ = local_3e8._40_8_;
      local_328._8_8_ = local_3e8._16_8_;
      local_328._16_8_ = local_3e8._24_8_;
      local_328._0_8_ = local_3e8._8_8_;
      auStack_330 = (undefined1  [8])local_3e8._0_8_;
      local_338._0_4_ = 8;
      builder_00 = &local_368.builder;
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(Builder *)local_338,builder_00);
      DynamicValue::Builder::~Builder((Builder *)local_338);
      local_218 = local_368.builder.segment;
joined_r0x001d54da:
      if (local_218 == (SegmentBuilder *)0x0) {
        return __return_storage_ptr__;
      }
      goto LAB_001d5acc;
    }
    pEVar1 = this->errorReporter;
    makeTypeName((String *)local_3e8,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)local_338,(kj *)"Type mismatch; expected ",(char (*) [25])local_3e8,
               (String *)0x2549e8,in_R8);
    auVar19 = local_338;
    if ((Schema)auStack_330 == (Schema)0x0) {
      auVar19 = (undefined1  [8])(SegmentReader *)0x2781dd;
    }
    uVar15 = 0;
    if (src._reader.dataSize < 0x40) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ulong)*(uint *)(puVar3 + 2);
      if (0x9f < src._reader.dataSize) {
        uVar15 = (ulong)*(uint *)(puVar3 + 8);
      }
    }
    (**pEVar1->_vptr_ErrorReporter)
              (pEVar1,uVar23,uVar15,auVar19,
               (uchar *)((long)auStack_330 + (ulong)((Schema)auStack_330 == (Schema)0x0)));
    auVar19 = local_338;
    if (local_338 != (undefined1  [8])0x0) {
      auVar12 = auStack_330;
      uVar7 = local_328._0_8_;
      local_338 = (undefined1  [8])0x0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_328._0_8_;
      _auStack_330 = auVar6 << 0x40;
      (*(code *)(*(Arena **)uVar7)->_vptr_Arena)(uVar7,auVar19,1,auVar12,auVar12,0);
    }
    uVar8 = local_3e8._8_8_;
    uVar7 = local_3e8._0_8_;
    if ((RawBrandedSchema *)local_3e8._0_8_ != (RawBrandedSchema *)0x0) {
      local_3e8._0_8_ = 0;
      local_3e8._8_8_ = (SegmentBuilder *)0x0;
      (**(code **)*(WirePointer *)local_3e8._16_8_)(local_3e8._16_8_,uVar7,1,uVar8,uVar8,0);
    }
    break;
  case 7:
    if (WVar20 == STRUCT && uVar2 == '\0') {
      SVar18 = Type::asStruct(&local_398);
      Orphanage::newOrphan((Orphan<capnp::DynamicStruct> *)local_228,&this->orphanage,SVar18);
      Orphan<capnp::DynamicStruct>::get(&local_150,(Orphan<capnp::DynamicStruct> *)local_228);
      bVar25 = src._reader.pointerCount == 0;
      if (bVar25) {
        local_328._0_8_ = (WirePointer *)0x0;
      }
      local_328._8_4_ = 0x7fffffff;
      if (!bVar25) {
        local_328._8_4_ = src._reader.nestingLimit;
      }
      local_338._0_4_ = UNKNOWN;
      local_338._4_4_ = 0;
      auStack_330._0_4_ = UNKNOWN;
      auStack_330._4_4_ = 0;
      if (!bVar25) {
        local_338._0_4_ = (Type)src._reader.segment;
        local_338._4_4_ = src._reader.segment._4_4_;
        auStack_330._0_4_ = (Type)src._reader.capTable;
        auStack_330._4_4_ = src._reader.capTable._4_4_;
      }
      capnp::_::PointerReader::getList
                (&local_180,(PointerReader *)local_338,INLINE_COMPOSITE,(word *)0x0);
      builder.builder.segment._0_4_ = (int)local_150.builder.segment;
      builder.schema.super_Schema.raw = local_150.schema.super_Schema.raw;
      builder.builder.segment._4_4_ = (int)((ulong)local_150.builder.segment >> 0x20);
      builder.builder.capTable._0_4_ = (int)local_150.builder.capTable;
      builder.builder.capTable._4_4_ = (int)((ulong)local_150.builder.capTable >> 0x20);
      builder.builder.data._0_4_ = (int)local_150.builder.data;
      builder.builder.data._4_4_ = (int)((ulong)local_150.builder.data >> 0x20);
      builder.builder.pointers._0_4_ = (int)local_150.builder.pointers;
      builder.builder.pointers._4_4_ = (int)((ulong)local_150.builder.pointers >> 0x20);
      builder.builder.dataSize = local_150.builder.dataSize;
      builder.builder._36_4_ = local_150.builder._36_4_;
      assignments.reader.capTable = local_180.capTable;
      assignments.reader.segment = local_180.segment;
      assignments.reader.ptr = local_180.ptr;
      assignments.reader.elementCount = local_180.elementCount;
      assignments.reader.step = local_180.step;
      assignments.reader.structDataSize = local_180.structDataSize;
      assignments.reader.structPointerCount = local_180.structPointerCount;
      assignments.reader.elementSize = local_180.elementSize;
      assignments.reader._39_1_ = local_180._39_1_;
      assignments.reader.nestingLimit = local_180.nestingLimit;
      assignments.reader._44_4_ = local_180._44_4_;
      fillStructValue(this,builder,assignments);
      Orphan<capnp::DynamicStruct>::get
                ((Builder *)local_3e8,(Orphan<capnp::DynamicStruct> *)local_228);
      local_328._24_8_ = local_3e8._32_8_;
      local_328._32_8_ = local_3e8._40_8_;
      local_328._8_8_ = local_3e8._16_8_;
      local_328._16_8_ = local_3e8._24_8_;
      local_328._0_8_ = local_3e8._8_8_;
      auStack_330 = (undefined1  [8])local_3e8._0_8_;
      local_338._0_4_ = 10;
      builder_00 = (OrphanBuilder *)(local_228 + 8);
      Orphan<capnp::DynamicValue>::Orphan(__return_storage_ptr__,(Builder *)local_338,builder_00);
      DynamicValue::Builder::~Builder((Builder *)local_338);
      goto joined_r0x001d54da;
    }
    pEVar1 = this->errorReporter;
    makeTypeName((String *)local_3e8,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)local_338,(kj *)"Type mismatch; expected ",(char (*) [25])local_3e8,
               (String *)0x2549e8,in_R8);
    auVar19 = local_338;
    if ((Schema)auStack_330 == (Schema)0x0) {
      auVar19 = (undefined1  [8])(SegmentReader *)0x2781dd;
    }
    uVar15 = 0;
    if (src._reader.dataSize < 0x40) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ulong)*(uint *)(puVar3 + 2);
      if (0x9f < src._reader.dataSize) {
        uVar15 = (ulong)*(uint *)(puVar3 + 8);
      }
    }
    (**pEVar1->_vptr_ErrorReporter)
              (pEVar1,uVar23,uVar15,auVar19,
               (uchar *)((long)auStack_330 + (ulong)((Schema)auStack_330 == (Schema)0x0)));
    auVar19 = local_338;
    if (local_338 != (undefined1  [8])0x0) {
      auVar12 = auStack_330;
      uVar7 = local_328._0_8_;
      local_338 = (undefined1  [8])0x0;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_328._0_8_;
      _auStack_330 = auVar4 << 0x40;
      (*(code *)(*(Arena **)uVar7)->_vptr_Arena)(uVar7,auVar19,1,auVar12,auVar12,0);
    }
    uVar8 = local_3e8._8_8_;
    uVar7 = local_3e8._0_8_;
    if ((RawBrandedSchema *)local_3e8._0_8_ != (RawBrandedSchema *)0x0) {
      local_3e8._0_8_ = 0;
      local_3e8._8_8_ = (SegmentBuilder *)0x0;
      (**(code **)*(WirePointer *)local_3e8._16_8_)(local_3e8._16_8_,uVar7,1,uVar8,uVar8,0);
    }
    break;
  case 8:
    if (WVar20 == DATA && uVar2 == '\0') {
      bVar25 = src._reader.pointerCount == 0;
      if (bVar25) {
        local_328._0_8_ = (WirePointer *)0x0;
      }
      local_328._8_4_ = 0x7fffffff;
      if (!bVar25) {
        local_328._8_4_ = src._reader.nestingLimit;
      }
      local_338._0_4_ = UNKNOWN;
      local_338._4_4_ = 0;
      auStack_330._0_4_ = UNKNOWN;
      auStack_330._4_4_ = 0;
      if (!bVar25) {
        local_338._0_4_ = (Type)src._reader.segment;
        local_338._4_4_ = src._reader.segment._4_4_;
        auStack_330._0_4_ = (Type)src._reader.capTable;
        auStack_330._4_4_ = src._reader.capTable._4_4_;
      }
      capnp::_::PointerReader::getBlob<capnp::Data>((PointerReader *)local_338,(void *)0x0,0);
      capnp::_::OrphanBuilder::copy
                ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
      local_3e8._8_8_ = auStack_330;
      local_3e8._16_8_ = local_328._0_8_;
      local_3e8._24_8_ = local_328._8_8_;
      local_3e8._0_8_ = local_338;
      _auStack_330 = (undefined1  [16])capnp::_::OrphanBuilder::asData((OrphanBuilder *)local_3e8);
      local_338._0_4_ = 7;
      Orphan<capnp::DynamicValue>::Orphan
                (__return_storage_ptr__,(Builder *)local_338,(OrphanBuilder *)local_3e8);
      DynamicValue::Builder::~Builder((Builder *)local_338);
      goto LAB_001d5abb;
    }
    pEVar1 = this->errorReporter;
    makeTypeName((String *)local_3e8,this,type);
    kj::str<char_const(&)[25],kj::String,char_const(&)[2]>
              ((String *)local_338,(kj *)"Type mismatch; expected ",(char (*) [25])local_3e8,
               (String *)0x2549e8,in_R8);
    auVar19 = local_338;
    if ((Schema)auStack_330 == (Schema)0x0) {
      auVar19 = (undefined1  [8])(SegmentReader *)0x2781dd;
    }
    uVar15 = 0;
    if (src._reader.dataSize < 0x40) {
      uVar23 = 0;
    }
    else {
      uVar23 = (ulong)*(uint *)(puVar3 + 2);
      if (0x9f < src._reader.dataSize) {
        uVar15 = (ulong)*(uint *)(puVar3 + 8);
      }
    }
    (**pEVar1->_vptr_ErrorReporter)
              (pEVar1,uVar23,uVar15,auVar19,
               (uchar *)((long)auStack_330 + (ulong)((Schema)auStack_330 == (Schema)0x0)));
    auVar19 = local_338;
    if (local_338 != (undefined1  [8])0x0) {
      auVar12 = auStack_330;
      uVar7 = local_328._0_8_;
      local_338 = (undefined1  [8])0x0;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_328._0_8_;
      _auStack_330 = auVar5 << 0x40;
      (*(code *)(*(Arena **)uVar7)->_vptr_Arena)(uVar7,auVar19,1,auVar12,auVar12,0);
    }
    uVar8 = local_3e8._8_8_;
    uVar7 = local_3e8._0_8_;
    if ((RawBrandedSchema *)local_3e8._0_8_ != (RawBrandedSchema *)0x0) {
      local_3e8._0_8_ = 0;
      local_3e8._8_8_ = (SegmentBuilder *)0x0;
      (**(code **)*(WirePointer *)local_3e8._16_8_)(local_3e8._16_8_,uVar7,1,uVar8,uVar8,0);
    }
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    (**this->resolver->_vptr_Resolver)(local_3e8);
    local_338[0] = local_3e8[0];
    if (local_3e8[0] == (EVP_PKEY_CTX)0x1) {
      DynamicValue::Reader::Reader((Reader *)auStack_330,(Reader *)(local_3e8 + 8));
    }
    if (((byte)local_3e8[0] & 1) != 0) {
      DynamicValue::Reader::~Reader((Reader *)(local_3e8 + 8));
    }
    EVar13 = local_338[0];
    if (local_338[0] != (EVP_PKEY_CTX)0x1) goto LAB_001d6029;
    DynamicValue::Reader::Reader(&local_f0,(Reader *)auStack_330);
    Orphanage::newOrphanCopy<capnp::DynamicValue::Reader>
              (__return_storage_ptr__,&this->orphanage,&local_f0);
    DynamicValue::Reader::~Reader(&local_f0);
LAB_001d5284:
    EVar13 = local_338[0];
LAB_001d603a:
    if (((byte)EVar13 & 1) == 0) {
      return __return_storage_ptr__;
    }
    DynamicValue::Reader::~Reader((Reader *)auStack_330);
    return __return_storage_ptr__;
  case 0xd:
    local_1f0 = this->resolver;
    bVar25 = src._reader.pointerCount == 0;
    if (bVar25) {
      local_328._0_8_ = (WirePointer *)0x0;
    }
    local_328._8_4_ = 0x7fffffff;
    if (!bVar25) {
      local_328._8_4_ = src._reader.nestingLimit;
    }
    local_338._0_4_ = UNKNOWN;
    local_338._4_4_ = 0;
    auStack_330._0_4_ = UNKNOWN;
    auStack_330._4_4_ = 0;
    if (!bVar25) {
      local_338._0_4_ = (Type)src._reader.segment;
      local_338._4_4_ = src._reader.segment._4_4_;
      auStack_330._0_4_ = (Type)src._reader.capTable;
      auStack_330._4_4_ = src._reader.capTable._4_4_;
    }
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)local_338,(word *)0x0);
    (*local_1f0->_vptr_Resolver[1])(local_3e8);
    uVar8 = local_3e8._16_8_;
    uVar7 = local_3e8._8_8_;
    uVar24 = local_3e8[0];
    local_368.schema.elementType.baseType._0_1_ = local_3e8[0];
    if (local_3e8[0] == (EVP_PKEY_CTX)0x1) {
      local_368.schema.elementType.field_4.schema = (RawBrandedSchema *)local_3e8._8_8_;
      local_368.builder.tag.content = local_3e8._16_8_;
      local_368.builder.segment = (SegmentBuilder *)local_3e8._24_8_;
      WVar20 = LIST;
      if (local_398.listDepth == '\0') {
        WVar20 = local_398.baseType;
      }
      if (WVar20 == TEXT) {
        capnp::_::OrphanBuilder::initText
                  ((OrphanBuilder *)local_338,(this->orphanage).arena,(this->orphanage).capTable,
                   (ByteCount)local_3e8._16_8_);
        local_3e8._8_8_ = auStack_330;
        local_3e8._16_8_ = local_328._0_8_;
        local_3e8._24_8_ = local_328._8_8_;
        local_3e8._0_8_ = local_338;
        capnp::_::OrphanBuilder::asText((Builder *)local_338,(OrphanBuilder *)local_3e8);
        memcpy((void *)auStack_330,(void *)uVar7,uVar8);
        Orphan<capnp::DynamicValue>::Orphan<capnp::Text>
                  (__return_storage_ptr__,(Orphan<capnp::Text> *)local_3e8);
        if ((SegmentBuilder *)local_3e8._8_8_ != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_3e8);
        }
        goto LAB_001d5be5;
      }
      if (WVar20 == DATA) {
        capnp::_::OrphanBuilder::copy
                  ((EVP_PKEY_CTX *)local_338,(EVP_PKEY_CTX *)(this->orphanage).arena);
        local_3e8._8_8_ = auStack_330;
        local_3e8._16_8_ = local_328._0_8_;
        local_3e8._24_8_ = local_328._8_8_;
        local_3e8._0_8_ = local_338;
        Orphan<capnp::DynamicValue>::Orphan<capnp::Data>
                  (__return_storage_ptr__,(Orphan<capnp::Data> *)local_3e8);
        if ((SegmentBuilder *)local_3e8._8_8_ != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)local_3e8);
        }
        goto LAB_001d5be5;
      }
      if (WVar20 == STRUCT) {
        if ((local_3e8._16_8_ & 7) == 0) {
          local_388.ptr = (word *)0x0;
          local_388.size_ = 0;
          local_388.disposer = (ArrayDisposer *)0x0;
          if ((local_3e8._8_8_ & 7) == 0) {
            pRVar22 = (RawBrandedSchema *)((ulong)local_3e8._16_8_ >> 3);
          }
          else {
            elementCount.raw = (RawBrandedSchema *)((ulong)local_3e8._16_8_ >> 3);
            local_338 = (undefined1  [8])
                        kj::_::HeapArrayDisposer::allocateImpl
                                  (8,(size_t)elementCount.raw,(size_t)elementCount.raw,
                                   (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
            sVar21 = local_388.size_;
            pwVar9 = local_388.ptr;
            local_328._0_8_ = &kj::_::HeapArrayDisposer::instance;
            bVar25 = (SegmentBuilder *)local_388.ptr != (SegmentBuilder *)0x0;
            local_388.ptr = (word *)local_338;
            local_388.size_ = (size_t)elementCount.raw;
            if (bVar25) {
              local_388.ptr = (word *)0x0;
              local_388.size_ = 0;
              auStack_330 = (undefined1  [8])elementCount.raw;
              (**(code **)*(WirePointer *)local_388.disposer)
                        (local_388.disposer,pwVar9,8,sVar21,sVar21,0,local_60.segment._0_4_,
                         local_60.capTable._0_4_,local_60.data._0_4_,local_60.pointers._0_4_,
                         local_60.dataSize,local_60.nestingLimit);
              local_388.ptr = (word *)local_338;
              local_388.size_ = (size_t)auStack_330;
            }
            local_338 = (undefined1  [8])0x0;
            auStack_330 = (undefined1  [8])0x0;
            local_388.disposer = (ArrayDisposer *)local_328._0_8_;
            kj::Array<capnp::word>::~Array((Array<capnp::word> *)local_338);
            memcpy(local_388.ptr,(void *)local_3e8._8_8_,local_3e8._16_8_);
            local_3e8._8_8_ = local_388.ptr;
            pRVar22 = (RawBrandedSchema *)local_388.size_;
          }
          array.size_ = (size_t)pRVar22;
          array.ptr = (word *)local_3e8._8_8_;
          options._8_8_ = 0x7fffffff;
          options.traversalLimitInWords = 0xffffffffffffffff;
          UnalignedFlatArrayMessageReader::UnalignedFlatArrayMessageReader
                    ((UnalignedFlatArrayMessageReader *)local_338,array,options);
          local_338 = (undefined1  [8])&PTR__UnalignedFlatArrayMessageReader_002be500;
          SVar18 = Type::asStruct(&local_398);
          MessageReader::getRoot<capnp::DynamicStruct,capnp::StructSchema>
                    ((Reader *)local_1b8,(MessageReader *)local_338,SVar18);
          local_3e8._0_8_ = local_1b8._0_8_;
          local_3e8._8_8_ = local_1b8._8_8_;
          local_3e8._48_8_ = local_188;
          local_3e8._32_8_ = local_1b8._32_8_;
          local_3e8._40_8_ = local_1b8._40_8_;
          local_3e8._16_8_ = local_1b8._16_8_;
          local_3e8._24_8_ = local_1b8._24_8_;
          capnp::_::OrphanBuilder::copy
                    ((OrphanBuilder *)&local_1e8,(EVP_PKEY_CTX *)(this->orphanage).arena,
                     (EVP_PKEY_CTX *)(this->orphanage).capTable);
          local_228._0_8_ = local_1b8._0_8_;
          local_218 = local_1e0;
          pWStack_210 = pWStack_1d8;
          local_228._8_8_ = local_1e8;
          Orphan<capnp::DynamicValue>::Orphan<capnp::DynamicStruct>
                    (__return_storage_ptr__,(Orphan<capnp::DynamicStruct> *)local_228);
          if (local_218 != (SegmentBuilder *)0x0) {
            capnp::_::OrphanBuilder::euthanize((OrphanBuilder *)(local_228 + 8));
          }
          UnalignedFlatArrayMessageReader::~UnalignedFlatArrayMessageReader
                    ((UnalignedFlatArrayMessageReader *)local_338);
          kj::Array<capnp::word>::~Array(&local_388);
          uVar24 = (undefined1)local_368.schema.elementType.baseType;
          goto LAB_001d5be5;
        }
        uVar15 = 0;
        if (src._reader.dataSize < 0x40) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)*(uint *)(puVar3 + 2);
          if (0x9f < src._reader.dataSize) {
            uVar15 = (ulong)*(uint *)(puVar3 + 8);
          }
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar23,uVar15,
                   "Embedded file is not a valid Cap\'n Proto message.",0x32);
      }
      else {
        uVar15 = 0;
        if (src._reader.dataSize < 0x40) {
          uVar23 = 0;
        }
        else {
          uVar23 = (ulong)*(uint *)(puVar3 + 2);
          if (0x9f < src._reader.dataSize) {
            uVar15 = (ulong)*(uint *)(puVar3 + 8);
          }
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar23,uVar15,
                   "Embeds can only be used when Text, Data, or a struct is expected.",0x42);
      }
    }
    __return_storage_ptr__->type = UNKNOWN;
    (__return_storage_ptr__->builder).tag.content = 0;
    (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
    (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
    (__return_storage_ptr__->builder).location = (word *)0x0;
LAB_001d5be5:
    wVar11.content = local_368.builder.tag.content;
    aVar10 = local_368.schema.elementType.field_4;
    if ((uVar24 & BOOL) == VOID) {
      return __return_storage_ptr__;
    }
    if ((SegmentBuilder *)local_368.schema.elementType.field_4.schema == (SegmentBuilder *)0x0) {
      return __return_storage_ptr__;
    }
    local_368.schema.elementType.field_4.schema = (RawBrandedSchema *)0x0;
    local_368.builder.tag.content = 0;
    (*(code *)(((local_368.builder.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_368.builder.segment,aVar10.schema,1,wVar11.content,wVar11.content,0);
    return __return_storage_ptr__;
  default:
    kj::_::unreachable();
  }
switchD_001d51db_caseD_0:
  __return_storage_ptr__->type = UNKNOWN;
LAB_001d518a:
  (__return_storage_ptr__->builder).tag.content = 0;
  (__return_storage_ptr__->builder).segment = (SegmentBuilder *)0x0;
  (__return_storage_ptr__->builder).capTable = (CapTableBuilder *)0x0;
  (__return_storage_ptr__->builder).location = (word *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Orphan<DynamicValue> ValueTranslator::compileValueInner(Expression::Reader src, Type type) {
  switch (src.which()) {
    case Expression::RELATIVE_NAME: {
      auto name = src.getRelativeName();

      // The name is just a bare identifier.  It may be a literal value or an enumerant.
      kj::StringPtr id = name.getValue();

      if (type.isEnum()) {
        KJ_IF_MAYBE(enumerant, type.asEnum().findEnumerantByName(id)) {
          return DynamicEnum(*enumerant);
        }
      } else {
        // Interpret known constant values.
        if (id == "void") {
          return VOID;
        } else if (id == "true") {
          return true;
        } else if (id == "false") {
          return false;
        } else if (id == "nan") {
          return kj::nan();
        } else if (id == "inf") {
          return kj::inf();
        }
      }

      // Apparently not a literal. Try resolving it.
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }
    }

    case Expression::ABSOLUTE_NAME:
    case Expression::IMPORT:
    case Expression::APPLICATION:
    case Expression::MEMBER:
      KJ_IF_MAYBE(constValue, resolver.resolveConstant(src)) {
        return orphanage.newOrphanCopy(*constValue);
      } else {
        return nullptr;
      }

    case Expression::EMBED:
      KJ_IF_MAYBE(data, resolver.readEmbed(src.getEmbed())) {
        switch (type.which()) {
          case schema::Type::TEXT: {
            // Sadly, we need to make a copy to add the NUL terminator.
            auto text = orphanage.newOrphan<Text>(data->size());
            memcpy(text.get().begin(), data->begin(), data->size());
            return kj::mv(text);
          }
          case schema::Type::DATA:
            // TODO(perf): It would arguably be neat to use orphanage.referenceExternalData(),
            //   since typically the data is mmap()ed and this would avoid forcing a large file
            //   to become memory-resident. However, we'd have to figure out who should own the
            //   Array<byte>. Also, we'd have to deal with the possibility of misaligned data --
            //   though arguably in that case we know it's not mmap()ed so whatever. One more
            //   thing: it would be neat to be able to reference text blobs this way too, if only
            //   we could rely on the assumption that as long as the data doesn't end on a page
            //   boundary, it will be zero-padded, thus giving us our NUL terminator (4095/4096 of
            //   the time), but this seems to require documenting constraints on the underlying
            //   file-reading interfaces. Hm.
            return orphanage.newOrphanCopy(Data::Reader(*data));
          case schema::Type::STRUCT: {
            // We will almost certainly
            if (data->size() % sizeof(word) != 0) {
              errorReporter.addErrorOn(src,
                  "Embedded file is not a valid Cap'n Proto message.");
              return nullptr;
            }
            kj::Array<word> copy;
            kj::ArrayPtr<const word> words;
            if (reinterpret_cast<uintptr_t>(data->begin()) % sizeof(void*) == 0) {
              // Hooray, data is aligned.
              words = kj::ArrayPtr<const word>(
                  reinterpret_cast<const word*>(data->begin()),
                  data->size() / sizeof(word));
            } else {
              // Ugh, data not aligned. Make a copy.
              copy = kj::heapArray<word>(data->size() / sizeof(word));
              memcpy(copy.begin(), data->begin(), data->size());
              words = copy;
            }
            ReaderOptions options;
            options.traversalLimitInWords = kj::maxValue;
            options.nestingLimit = kj::maxValue;
            FlatArrayMessageReader reader(words, options);
            return orphanage.newOrphanCopy(reader.getRoot<DynamicStruct>(type.asStruct()));
          }
          default:
            errorReporter.addErrorOn(src,
                "Embeds can only be used when Text, Data, or a struct is expected.");
            return nullptr;
        }
      } else {
        return nullptr;
      }

    case Expression::POSITIVE_INT:
      return src.getPositiveInt();

    case Expression::NEGATIVE_INT: {
      uint64_t nValue = src.getNegativeInt();
      if (nValue > ((uint64_t)kj::maxValue >> 1) + 1) {
        errorReporter.addErrorOn(src, "Integer is too big to be negative.");
        return nullptr;
      } else {
        return kj::implicitCast<int64_t>(-nValue);
      }
    }

    case Expression::FLOAT:
      return src.getFloat();
      break;

    case Expression::STRING:
      if (type.isData()) {
        Text::Reader text = src.getString();
        return orphanage.newOrphanCopy(Data::Reader(text.asBytes()));
      } else {
        return orphanage.newOrphanCopy(src.getString());
      }
      break;

    case Expression::BINARY:
      if (!type.isData()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      return orphanage.newOrphanCopy(src.getBinary());

    case Expression::LIST: {
      if (!type.isList()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto listSchema = type.asList();
      Type elementType = listSchema.getElementType();
      auto srcList = src.getList();
      Orphan<DynamicList> result = orphanage.newOrphan(listSchema, srcList.size());
      auto dstList = result.get();
      for (uint i = 0; i < srcList.size(); i++) {
        KJ_IF_MAYBE(value, compileValue(srcList[i], elementType)) {
          dstList.adopt(i, kj::mv(*value));
        }
      }
      return kj::mv(result);
    }

    case Expression::TUPLE: {
      if (!type.isStruct()) {
        errorReporter.addErrorOn(src, kj::str("Type mismatch; expected ", makeTypeName(type), "."));
        return nullptr;
      }
      auto structSchema = type.asStruct();
      Orphan<DynamicStruct> result = orphanage.newOrphan(structSchema);
      fillStructValue(result.get(), src.getTuple());
      return kj::mv(result);
    }

    case Expression::UNKNOWN:
      // Ignore earlier error.
      return nullptr;
  }

  KJ_UNREACHABLE;
}